

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void modifyDeepChannels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels,half delta)

{
  uint uVar1;
  bool bVar2;
  reference this;
  half *this_00;
  long lVar3;
  uint *puVar4;
  Array2D<unsigned_int> *in_RDI;
  uint32_t j;
  uint32_t count;
  int x;
  int y;
  Array2D<Imath_3_2::half_*> *channel;
  iterator i;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  *in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffb0;
  uint local_40;
  int local_38;
  int local_34;
  _Self local_28;
  _Self local_20 [2];
  Array2D<unsigned_int> *local_10;
  
  local_10 = in_RDI;
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
       ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar2 = std::operator!=(local_20,&local_28);
    if (!bVar2) break;
    this = std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_> *)0x11a596);
    local_34 = 0;
    while( true ) {
      this_00 = (half *)(long)local_34;
      lVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::height(this);
      if (lVar3 <= (long)this_00) break;
      local_38 = 0;
      while( true ) {
        lVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::width(this);
        if (lVar3 <= local_38) break;
        puVar4 = Imf_3_4::Array2D<unsigned_int>::operator[](local_10,(long)local_34);
        uVar1 = puVar4[local_38];
        for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
          Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](this,(long)local_34);
          Imath_3_2::half::operator+=
                    (this_00,(half)(uint16_t)((ulong)in_stack_ffffffffffffffb0._M_node >> 0x30));
        }
        local_38 = local_38 + 1;
      }
      local_34 = local_34 + 1;
    }
    in_stack_ffffffffffffffb0 =
         std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator++(local_20,0);
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}